

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::StaticInitializerVisitor::visit<slang::ast::LValueReferenceExpression>
          (StaticInitializerVisitor *this,LValueReferenceExpression *expr)

{
  ExpressionKind EVar1;
  SymbolKind SVar2;
  ExpressionSyntax *pEVar3;
  SystemSubroutine *pSVar4;
  ConstantValue *pCVar5;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar6;
  pointer ppFVar7;
  optional<bool> oVar8;
  int iVar9;
  Symbol *this_00;
  Expression *pEVar10;
  Diagnostic *this_01;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar11;
  Diagnostic *this_02;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar12;
  byte *pbVar13;
  VariableSymbol *var;
  bool bVar14;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 - NamedValue < 2) {
    this_00 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (this_00 != (Symbol *)0x0) {
      SVar2 = this_00->kind;
      if ((SVar2 == ModportPort) || (SVar2 == Net)) {
        this_01 = ASTContext::addDiag(this->context,(DiagCode)0xf80006,
                                      (expr->super_Expression).sourceRange);
LAB_0029564f:
        this_02 = Diagnostic::operator<<(this_01,this->sourceVar->name);
        Diagnostic::operator<<(this_02,this_00->name);
        Diagnostic::addNote(this_01,(DiagCode)0x50001,this_00->location);
        return;
      }
      if ((SVar2 == Variable) && (this_00 != this->sourceVar)) {
        pEVar10 = DeclaredType::getInitializer((DeclaredType *)(this_00 + 1));
        bVar14 = this_00[5].name._M_len != 0;
        oVar8 = Symbol::isDeclaredBefore(this_00,this->sourceVar);
        if ((bVar14 || pEVar10 == (Expression *)0x0) ||
           ((((ushort)oVar8.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 0x100) == 0 ||
            (((ushort)oVar8.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 1) == 0)))) {
          this_01 = ASTContext::addDiag(this->context,
                                        (DiagCode)
                                        ((uint)(bVar14 || pEVar10 == (Expression *)0x0) * 0x10000 +
                                        0xf70006),(expr->super_Expression).sourceRange);
          goto LAB_0029564f;
        }
      }
    }
  }
  else if (EVar1 == Call) {
    CallExpression::visitExprsNoArgs<slang::ast::StaticInitializerVisitor&>
              ((CallExpression *)expr,this);
    if ((char)expr[2].super_Expression.kind == IntegerLiteral) {
      pvVar11 = std::
                get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)(expr + 1));
      pEVar3 = expr[2].super_Expression.syntax;
      if (pEVar3 != (ExpressionSyntax *)0x0) {
        pSVar4 = (pvVar11->subroutine).ptr;
        pCVar5 = expr[2].super_Expression.constant;
        pbVar13 = (byte *)0x0;
        do {
          iVar9 = (*pSVar4->_vptr_SystemSubroutine[4])(pSVar4,pbVar13);
          if ((char)iVar9 == '\0') {
            pEVar10 = *(Expression **)
                       ((long)&(pCVar5->value).
                               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               ._M_u + (long)pbVar13 * 8);
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                      (pEVar10,pEVar10,this);
          }
          pbVar13 = pbVar13 + 1;
        } while (pEVar3 != (ExpressionSyntax *)pbVar13);
      }
    }
    else {
      ppSVar12 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)(expr + 1));
      pSVar6 = *ppSVar12;
      if ((pSVar6->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar6->super_Scope);
      }
      pEVar3 = expr[2].super_Expression.syntax;
      if (pEVar3 != (ExpressionSyntax *)0x0) {
        ppFVar7 = (pSVar6->arguments)._M_ptr;
        pCVar5 = expr[2].super_Expression.constant;
        pbVar13 = (byte *)0x0;
        do {
          if (ppFVar7[(long)pbVar13]->direction == In) {
            pEVar10 = *(Expression **)
                       ((long)&(pCVar5->value).
                               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               ._M_u + (long)pbVar13 * 8);
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                      (pEVar10,pEVar10,this);
          }
          pbVar13 = pbVar13 + 1;
        } while (pEVar3 != (ExpressionSyntax *)pbVar13);
      }
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::Variable) {
                            // Don't warn if this is the same var.
                            auto& var = sym->template as<VariableSymbol>();
                            if (&var == &sourceVar)
                                return;

                            const bool hasInit = var.getInitializer();
                            const bool isFromPort = var.getFirstPortBackref();
                            const bool isDeclaredBefore = var.isDeclaredBefore(sourceVar).value_or(
                                false);

                            // We warn unless this var has an initializer, is declared
                            // before us in the same instance, and isn't attached to a port.
                            if (hasInit && !isFromPort && isDeclaredBefore)
                                return;

                            auto code = (hasInit && !isFromPort) ? diag::StaticInitOrder
                                                                 : diag::StaticInitValue;
                            auto& diag = context.addDiag(code, expr.sourceRange);
                            diag << sourceVar.name << var.name;
                            diag.addNote(diag::NoteDeclarationHere, var.location);
                        }
                        else if (sym->kind == SymbolKind::Net ||
                                 sym->kind == SymbolKind::ModportPort) {
                            auto& diag = context.addDiag(diag::StaticInitValue, expr.sourceRange);
                            diag << sourceVar.name << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    call.visitExprsNoArgs(*this);

                    if (call.isSystemCall()) {
                        // Ignore unevaluated arguments to system calls.
                        auto& sub = *std::get<1>(call.subroutine).subroutine;
                        auto args = call.arguments();
                        for (size_t i = 0; i < args.size(); i++) {
                            if (!sub.isArgUnevaluated(i))
                                args[i]->visit(*this);
                        }
                    }
                    else {
                        // Skip over output, inout, and ref args.
                        auto& sub = *std::get<0>(call.subroutine);
                        auto formals = sub.getArguments();
                        auto args = call.arguments();
                        SLANG_ASSERT(formals.size() == args.size());
                        for (size_t i = 0; i < args.size(); i++) {
                            if (formals[i]->direction == ArgumentDirection::In)
                                args[i]->visit(*this);
                        }
                    }
                    break;
                }
                case ExpressionKind::NewCovergroup:
                    // Ignore new covergroup expressions.
                    break;
                default:
                    if constexpr (HasVisitExprs<T, StaticInitializerVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }